

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O3

void __thiscall
soplex::SPxMainSM<double>::FreeZeroObjVariablePS::FreeZeroObjVariablePS
          (FreeZeroObjVariablePS *this,SPxLPBase<double> *lp,int _j,bool loFree,
          DSVectorBase<double> *col_idx_sorted,shared_ptr<soplex::Tolerances> *tols)

{
  double dVar1;
  element_type *peVar2;
  Nonzero<double> *pNVar3;
  VectorBase<double> *pVVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  double dVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  peVar2 = (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38._M_pi =
       (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
    }
  }
  iVar5 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  iVar9 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_003afb68;
  (this->super_PostStep).m_name = "FreeZeroObjVariable";
  (this->super_PostStep).nCols = iVar9;
  (this->super_PostStep).nRows = iVar5;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_38);
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__FreeZeroObjVariablePS_003b0138;
  this->m_j = _j;
  this->m_old_j = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum + -1;
  this->m_old_i = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum + -1;
  pVVar4 = &(lp->super_LPColSetBase<double>).low;
  if (loFree) {
    pVVar4 = &(lp->super_LPColSetBase<double>).up;
  }
  this->m_bnd = (pVVar4->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[_j];
  DSVectorBase<double>::DSVectorBase(&this->m_col,col_idx_sorted);
  iVar5 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem
          [(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[_j].idx].data.
          super_SVectorBase<double>.memused;
  (this->m_lRhs).super_SVectorBase<double>.m_elem = (Nonzero<double> *)0x0;
  (this->m_lRhs).super_SVectorBase<double>.memsize = 0;
  (this->m_lRhs).super_SVectorBase<double>.memused = 0;
  (this->m_lRhs)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003ae9c8;
  (this->m_lRhs).theelem = (Nonzero<double> *)0x0;
  if (iVar5 < 1) {
    iVar5 = 2;
  }
  spx_alloc<soplex::Nonzero<double>*>(&(this->m_lRhs).theelem,iVar5);
  (this->m_lRhs).super_SVectorBase<double>.m_elem = (this->m_lRhs).theelem;
  (this->m_lRhs).super_SVectorBase<double>.memused = 0;
  (this->m_lRhs).super_SVectorBase<double>.memsize = iVar5;
  iVar5 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem
          [(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[_j].idx].data.
          super_SVectorBase<double>.memused;
  (this->m_rowObj).super_SVectorBase<double>.m_elem = (Nonzero<double> *)0x0;
  (this->m_rowObj).super_SVectorBase<double>.memsize = 0;
  (this->m_rowObj).super_SVectorBase<double>.memused = 0;
  (this->m_rowObj)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003ae9c8;
  (this->m_rowObj).theelem = (Nonzero<double> *)0x0;
  iVar9 = 2;
  if (0 < iVar5) {
    iVar9 = iVar5;
  }
  spx_alloc<soplex::Nonzero<double>*>(&(this->m_rowObj).theelem,iVar9);
  (this->m_rowObj).super_SVectorBase<double>.m_elem = (this->m_rowObj).theelem;
  (this->m_rowObj).super_SVectorBase<double>.memused = 0;
  (this->m_rowObj).super_SVectorBase<double>.memsize = iVar9;
  Array<soplex::DSVectorBase<double>_>::Array
            (&this->m_rows,
             (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem
             [(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[_j].idx].data.
             super_SVectorBase<double>.memused);
  this->m_loFree = loFree;
  if (0 < (this->m_col).super_SVectorBase<double>.memused) {
    lVar7 = 4;
    lVar6 = 0;
    lVar8 = 0;
    do {
      pNVar3 = (this->m_col).super_SVectorBase<double>.m_elem;
      iVar5 = *(int *)((long)&pNVar3->val + lVar7 * 2);
      dVar1 = *(double *)((long)pNVar3 + lVar7 * 2 + -8);
      iVar9 = (int)lVar8;
      if (this->m_loFree == true) {
        if (dVar1 <= 0.0) goto LAB_0021e2f1;
LAB_0021e316:
        DSVectorBase<double>::add
                  (&this->m_lRhs,iVar9,
                   (lp->super_LPRowSetBase<double>).right.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + iVar5);
      }
      else {
        if (dVar1 < 0.0) goto LAB_0021e316;
LAB_0021e2f1:
        DSVectorBase<double>::add
                  (&this->m_lRhs,iVar9,
                   (lp->super_LPRowSetBase<double>).left.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + iVar5);
      }
      DSVectorBase<double>::operator=
                ((DSVectorBase<double> *)
                 ((long)&((this->m_rows).data.
                          super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_vptr_DSVectorBase + lVar6),
                 (SVectorBase<double> *)
                 ((lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                 (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[iVar5].idx));
      dVar1 = (lp->super_LPRowSetBase<double>).object.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[iVar5];
      dVar10 = dVar1;
      if (lp->thesense == MINIMIZE) {
        dVar10 = -dVar1;
      }
      DSVectorBase<double>::makeMem(&this->m_rowObj,1);
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        iVar5 = (this->m_rowObj).super_SVectorBase<double>.memused;
        pNVar3 = (this->m_rowObj).super_SVectorBase<double>.m_elem;
        pNVar3[iVar5].idx = iVar9;
        pNVar3[iVar5].val = dVar10;
        (this->m_rowObj).super_SVectorBase<double>.memused = iVar5 + 1;
      }
      lVar8 = lVar8 + 1;
      lVar6 = lVar6 + 0x20;
      lVar7 = lVar7 + 8;
    } while (lVar8 < (this->m_col).super_SVectorBase<double>.memused);
  }
  return;
}

Assistant:

FreeZeroObjVariablePS(const SPxLPBase<R>& lp, int _j, bool loFree,
                            DSVectorBase<R> col_idx_sorted, std::shared_ptr<Tolerances> tols)
         : PostStep("FreeZeroObjVariable", tols, lp.nRows(), lp.nCols())
         , m_j(_j)
         , m_old_j(lp.nCols() - 1)
         , m_old_i(lp.nRows() - 1)
         , m_bnd(loFree ? lp.upper(_j) : lp.lower(_j))
         , m_col(col_idx_sorted)
         , m_lRhs(lp.colVector(_j).size())
         , m_rowObj(lp.colVector(_j).size())
         , m_rows(lp.colVector(_j).size())
         , m_loFree(loFree)
      {
         for(int k = 0; k < m_col.size(); ++k)
         {
            int r = m_col.index(k);

            if((m_loFree  && m_col.value(k) > 0) ||
                  (!m_loFree && m_col.value(k) < 0))
               m_lRhs.add(k, lp.rhs(r));
            else
               m_lRhs.add(k, lp.lhs(r));

            m_rows[k] = lp.rowVector(r);
            m_rowObj.add(k, lp.rowObj(r));
         }
      }